

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O0

bool hasCollisions<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,size_t n,
               vector<bool,_std::allocator<bool>_> *hash_table)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  unsigned_long uVar4;
  const_reference pvVar5;
  reference local_70;
  reference local_60;
  uint local_4c;
  size_type sStack_48;
  uint32_t h;
  size_t i_1;
  ulong local_30;
  size_t i;
  vector<bool,_std::allocator<bool>_> *hash_table_local;
  size_t n_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *keys_local;
  
  i = (size_t)hash_table;
  hash_table_local = (vector<bool,_std::allocator<bool>_> *)n;
  n_local = (size_t)keys;
  for (local_30 = n; uVar1 = local_30, uVar4 = std::numeric_limits<unsigned_long>::max(),
      uVar1 < uVar4; local_30 = local_30 - 1) {
    _i_1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)i,local_30);
    std::_Bit_reference::operator=((_Bit_reference *)&i_1,false);
  }
  sStack_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)n_local);
  while( true ) {
    sStack_48 = sStack_48 - 1;
    uVar1 = sStack_48;
    uVar4 = std::numeric_limits<unsigned_long>::max();
    if (uVar4 <= uVar1) {
      return false;
    }
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)n_local,sStack_48
                       );
    uVar3 = hash((uint)*pvVar5);
    local_4c = uVar3 & (uint)hash_table_local;
    local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)i,(ulong)local_4c);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_60);
    if (bVar2) break;
    local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)i,(ulong)local_4c);
    std::_Bit_reference::operator=(&local_70,true);
  }
  return true;
}

Assistant:

static bool hasCollisions(const std::vector<KeyType>& keys, size_t n, std::vector<bool>& hash_table){
    for(size_t i = n; i < std::numeric_limits<size_t>::max(); i--)
        hash_table[i] = false;

    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--){
        uint32_t h = hash(keys[i]) & n;
        if(hash_table[h]) return true;
        hash_table[h] = true;
    }

    return false;
}